

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerJson.cxx
# Opt level: O0

void __thiscall
cmDebugServerJson::cmDebugServerJson(cmDebugServerJson *this,cmDebugger *debugger,string *name)

{
  cmPipeConnection *this_00;
  cmServerBufferStrategy *this_01;
  string *name_local;
  cmDebugger *debugger_local;
  cmDebugServerJson *this_local;
  
  this_00 = (cmPipeConnection *)operator_new(0x88);
  this_01 = (cmServerBufferStrategy *)operator_new(0x28);
  (this_01->RequestBuffer)._M_string_length = 0;
  (this_01->RequestBuffer).field_2._M_allocated_capacity = 0;
  (this_01->super_cmConnectionBufferStrategy)._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  *(undefined8 *)&this_01->RequestBuffer = 0;
  *(undefined8 *)((long)&(this_01->RequestBuffer).field_2 + 8) = 0;
  cmServerBufferStrategy::cmServerBufferStrategy(this_01);
  cmPipeConnection::cmPipeConnection(this_00,name,(cmConnectionBufferStrategy *)this_01);
  cmDebugServerJson(this,debugger,(cmConnection *)this_00);
  return;
}

Assistant:

cmDebugServerJson::cmDebugServerJson(cmDebugger& debugger,
                                     const std::string& name)
  : cmDebugServerJson(debugger,
                      new cmPipeConnection(name, new cmServerBufferStrategy()))
{
}